

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VTKData.h
# Opt level: O1

void __thiscall
VTKPointDescriptor<MercuryParticle<2UL>_>::~VTKPointDescriptor
          (VTKPointDescriptor<MercuryParticle<2UL>_> *this)

{
  pointer ppVVar1;
  vector<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>
  *__range2;
  pointer ppVVar2;
  
  ppVVar1 = (this->entries_).
            super__Vector_base<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVVar2 = (this->entries_).
                 super__Vector_base<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVVar2 != ppVVar1;
      ppVVar2 = ppVVar2 + 1) {
    if (*ppVVar2 != (VTKPointDescriptorEntry<MercuryParticle<2UL>_> *)0x0) {
      (*(*ppVVar2)->_vptr_VTKPointDescriptorEntry[1])();
    }
  }
  ppVVar2 = (this->entries_).
            super__Vector_base<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppVVar2 != (pointer)0x0) {
    operator_delete(ppVVar2);
    return;
  }
  return;
}

Assistant:

~VTKPointDescriptor()
  {
    for (auto * d : entries_)
      delete d;
  }